

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O2

void __thiscall
ins_ekf::InsEkf::ProcessMeasurement
          (InsEkf *this,vector<double,_std::allocator<double>_> *measurement,double dt)

{
  Matrix<double,_11,_1,_0,_11,_1> *vector;
  pointer pdVar1;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar2;
  VectorXd gps_meas;
  undefined1 local_a0 [16];
  double local_90;
  XprTypeNested local_88;
  Vector3d axyz_meas;
  Vector3d pqr_meas;
  
  pdVar1 = (measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 == 0x58) {
    local_a0._0_8_ = &pqr_meas;
    local_a0._8_8_ = 0.0;
    local_90 = 4.94065645841247e-324;
    local_88 = (XprTypeNested)0x1;
    pqr_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *pdVar1;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0,
                        pdVar1 + 1);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar2,(measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + 2);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0);
    pdVar1 = (measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_a0._0_8_ = &axyz_meas;
    local_a0._8_8_ = 0.0;
    local_90 = 4.94065645841247e-324;
    local_88 = (XprTypeNested)0x1;
    axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = pdVar1[3];
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0,
                        pdVar1 + 4);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar2,(measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + 5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0);
    RotateVectByQuat((Vector3d *)local_a0,&this->imu_orientation_,&pqr_meas);
    pqr_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_90;
    pqr_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)local_a0._0_8_;
    pqr_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)local_a0._8_8_;
    RotateVectByQuat((Vector3d *)local_a0,&this->imu_orientation_,&axyz_meas);
    axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_90;
    axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)local_a0._0_8_;
    axyz_meas.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)local_a0._8_8_;
    vector = &this->last_measurements_;
    Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)local_a0,vector,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false> *)local_a0,&pqr_meas);
    Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)local_a0,vector,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false> *)local_a0,&axyz_meas);
    if (this->gps_update_rate_ <= ProcessMeasurement::t_since_last_gps) {
      local_a0._0_8_ =
           (measurement->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start + 6;
      local_a0._8_8_ = 2.47032822920623e-323;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&gps_meas,
                 (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_a0);
      Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)local_a0,vector,6,5);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,11,1,0,11,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false> *)local_a0,&gps_meas);
      ProcessMeasurement::t_since_last_gps = 0.0;
      free(gps_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
    }
    else {
      Eigen::VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1> *)local_a0,vector,6,5);
      gps_meas.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)nan("");
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,_-1,_1,_false>_>::
      setConstant((DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_1,_0,_11,_1>,__1,_1,_false>_> *)
                  local_a0,(Scalar *)&gps_meas);
      ProcessMeasurement::t_since_last_gps = dt + ProcessMeasurement::t_since_last_gps;
    }
    return;
  }
  __assert_fail("measurement.size() == m_I(MI::NUM_MEASUREMENTS)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/KWoiceshyn[P]ins_ekf/src/ins_ekf.cpp"
                ,0x2a,
                "void ins_ekf::InsEkf::ProcessMeasurement(const std::vector<double> &, double)");
}

Assistant:

void InsEkf::ProcessMeasurement(const std::vector<double>& measurement, double dt) {

        static double t_since_last_gps = 0.0;
        assert(measurement.size() == m_I(MI::NUM_MEASUREMENTS));

        Eigen::Vector3d pqr_meas, axyz_meas;
        pqr_meas << measurement[m_I(MI::p)], measurement[m_I(MI::q)], measurement[m_I(MI::r)];
        axyz_meas << measurement[m_I(MI::ax)], measurement[m_I(MI::ay)], measurement[m_I(MI::az)];

        // transform measurements from sensor frame to vehicle body frame
        pqr_meas = RotateVectByQuat(imu_orientation_, pqr_meas);
        axyz_meas = RotateVectByQuat(imu_orientation_, axyz_meas);

        last_measurements_.segment(m_I(MI::p), 3) = pqr_meas;
        last_measurements_.segment(m_I(MI::ax), 3) = axyz_meas;

        // capture GPS measurements if they are available
        if(t_since_last_gps >= gps_update_rate_){
            const Eigen::VectorXd gps_meas = Eigen::Map<const Eigen::VectorXd>(measurement.data() + 6, 5);
            last_measurements_.segment(m_I(MI::gpsX), 5) = gps_meas;
            t_since_last_gps = 0;
        }else {
            last_measurements_.segment(m_I(MI::gpsX), 5).setConstant(std::nan(""));
            t_since_last_gps += dt;
        }
    }